

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_marked(REF_SHARD ref_shard,REF_INT node0,REF_INT node1,REF_BOOL *marked)

{
  int local_2c;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT face;
  REF_BOOL *marked_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_SHARD ref_shard_local;
  
  *marked = 0;
  _ref_private_macro_code_rss = marked;
  marked_local._0_4_ = node1;
  marked_local._4_4_ = node0;
  _node1_local = ref_shard;
  ref_shard_local._4_4_ = ref_face_spanning(ref_shard->face,node0,node1,&local_2c);
  if (ref_shard_local._4_4_ == 0) {
    if (_node1_local->mark[local_2c] == 0) {
      ref_shard_local._4_4_ = 0;
    }
    else {
      if (((_node1_local->mark[local_2c] == 2) &&
          (marked_local._4_4_ == _node1_local->face->f2n[local_2c * 4 + 2])) &&
         ((REF_INT)marked_local == _node1_local->face->f2n[local_2c << 2])) {
        *_ref_private_macro_code_rss = 1;
      }
      if (((_node1_local->mark[local_2c] == 2) &&
          ((REF_INT)marked_local == _node1_local->face->f2n[local_2c * 4 + 2])) &&
         (marked_local._4_4_ == _node1_local->face->f2n[local_2c << 2])) {
        *_ref_private_macro_code_rss = 1;
      }
      if (((_node1_local->mark[local_2c] == 3) &&
          (marked_local._4_4_ == _node1_local->face->f2n[local_2c * 4 + 3])) &&
         ((REF_INT)marked_local == _node1_local->face->f2n[local_2c * 4 + 1])) {
        *_ref_private_macro_code_rss = 1;
      }
      if (((_node1_local->mark[local_2c] == 3) &&
          ((REF_INT)marked_local == _node1_local->face->f2n[local_2c * 4 + 3])) &&
         (marked_local._4_4_ == _node1_local->face->f2n[local_2c * 4 + 1])) {
        *_ref_private_macro_code_rss = 1;
      }
      ref_shard_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x60,
           "ref_shard_marked",(ulong)ref_shard_local._4_4_,"missing face");
  }
  return ref_shard_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_shard_marked(REF_SHARD ref_shard, REF_INT node0,
                                    REF_INT node1, REF_BOOL *marked) {
  REF_INT face;

  *marked = REF_FALSE;

  RSS(ref_face_spanning(ref_shard_face(ref_shard), node0, node1, &face),
      "missing face");

  if (0 == ref_shard_mark(ref_shard, face)) return REF_SUCCESS;

  if (2 == ref_shard_mark(ref_shard, face) &&
      node0 == ref_face_f2n(ref_shard_face(ref_shard), 2, face) &&
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 0, face))
    *marked = REF_TRUE;

  if (2 == ref_shard_mark(ref_shard, face) &&
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 2, face) &&
      node0 == ref_face_f2n(ref_shard_face(ref_shard), 0, face))
    *marked = REF_TRUE;

  if (3 == ref_shard_mark(ref_shard, face) &&
      node0 == ref_face_f2n(ref_shard_face(ref_shard), 3, face) &&
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 1, face))
    *marked = REF_TRUE;

  if (3 == ref_shard_mark(ref_shard, face) &&
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 3, face) &&
      node0 == ref_face_f2n(ref_shard_face(ref_shard), 1, face))
    *marked = REF_TRUE;

  return REF_SUCCESS;
}